

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O2

int run_test_uname(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b_1;
  int64_t eval_b_2;
  utsname buf;
  uv_utsname_t buffer;
  
  iVar1 = uv_os_uname(0);
  lVar2 = (long)iVar1;
  buf.sysname[0] = -0x16;
  buf.sysname[1] = -1;
  buf.sysname[2] = -1;
  buf.sysname[3] = -1;
  buf.sysname[4] = -1;
  buf.sysname[5] = -1;
  buf.sysname[6] = -1;
  buf.sysname[7] = -1;
  buffer.sysname._0_8_ = lVar2;
  if (lVar2 == -0x16) {
    iVar1 = uv_os_uname(&buffer);
    lVar2 = (long)iVar1;
    buf.sysname._0_8_ = lVar2;
    if (lVar2 == 0) {
      iVar1 = uname((utsname *)&buf);
      eval_b_2 = -1;
      if (iVar1 == -1) {
        pcVar4 = "!=";
        pcVar5 = "-1";
        pcVar3 = "uname(&buf)";
        uVar6 = 0x31;
        lVar2 = -1;
      }
      else {
        iVar1 = strcmp(buffer.sysname,buf.sysname);
        lVar2 = (long)iVar1;
        eval_b_2 = 0;
        if (lVar2 == 0) {
          iVar1 = strcmp(buffer.version,buf.version);
          lVar2 = (long)iVar1;
          eval_b_2 = 0;
          if (lVar2 == 0) {
            iVar1 = strcmp(buffer.release,buf.release);
            lVar2 = (long)iVar1;
            eval_b_2 = 0;
            if (lVar2 == 0) {
              iVar1 = strcmp(buffer.machine,buf.machine);
              lVar2 = (long)iVar1;
              eval_b_2 = 0;
              if (lVar2 == 0) {
                return 0;
              }
              pcVar4 = "==";
              pcVar5 = "0";
              pcVar3 = "strcmp(buffer.machine, buf.machine)";
              uVar6 = 0x3f;
            }
            else {
              pcVar4 = "==";
              pcVar5 = "0";
              pcVar3 = "strcmp(buffer.release, buf.release)";
              uVar6 = 0x39;
            }
          }
          else {
            pcVar4 = "==";
            pcVar5 = "0";
            pcVar3 = "strcmp(buffer.version, buf.version)";
            uVar6 = 0x33;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "strcmp(buffer.sysname, buf.sysname)";
          uVar6 = 0x32;
        }
      }
    }
    else {
      pcVar5 = "0";
      pcVar3 = "r";
      uVar6 = 0x2e;
      eval_b_2 = 0;
      pcVar4 = "==";
    }
  }
  else {
    pcVar5 = "UV_EINVAL";
    pcVar3 = "r";
    uVar6 = 0x2a;
    eval_b_2 = -0x16;
    pcVar4 = "==";
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,lVar2,pcVar4,eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT_OK(r);

#ifndef _WIN32
  ASSERT_NE(uname(&buf), -1);
  ASSERT_OK(strcmp(buffer.sysname, buf.sysname));
  ASSERT_OK(strcmp(buffer.version, buf.version));

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT_OK(strcmp(buffer.release, temp));
# else
  ASSERT_OK(strcmp(buffer.release, buf.release));
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT_OK(strcmp(buffer.machine, "ppc64"));
# else
  ASSERT_OK(strcmp(buffer.machine, buf.machine));
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}